

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::LRN_x86_avx::forward_inplace(LRN_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int *piVar6;
  pointer piVar7;
  uint uVar8;
  _func_int **pp_Var9;
  int iVar10;
  ulong uVar11;
  _func_int ***ppp_Var12;
  _func_int *p_Var13;
  int iVar14;
  float *pfVar15;
  _func_int ***ppp_Var16;
  void *pvVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  undefined1 (*pauVar26) [32];
  ulong uVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar34 [64];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  allocator_type local_1e1;
  Mat *local_1e0;
  Mat local_1d8;
  ulong local_188;
  undefined8 local_180;
  ulong local_178;
  ulong local_170;
  Mat local_168;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  long local_e8;
  Allocator *local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  _func_int ***local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  auVar2 = local_b8;
  auVar31 = in_ZMM2._0_16_;
  local_118 = (ulong)(uint)bottom_top_blob->w;
  local_b8._4_4_ = 0;
  local_b8._0_4_ = bottom_top_blob->h;
  uVar23 = bottom_top_blob->c;
  uVar27 = (ulong)uVar23;
  _elemsize = bottom_top_blob->elemsize;
  local_168.cstep = 0;
  local_168.data = (Allocator *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_168.elempack = 0;
  local_b8._8_24_ = auVar2._8_24_;
  local_168.allocator = (Allocator *)local_168.data;
  local_168.dims = (int)local_168.refcount;
  local_168.w = local_168.refcount._4_4_;
  local_168._48_8_ = local_168.elemsize;
  local_168.c = local_168.elempack;
  Mat::create(&local_168,bottom_top_blob->w,bottom_top_blob->h,uVar23,_elemsize,
              opt->workspace_allocator);
  iVar19 = -100;
  if (((Allocator *)local_168.data == (Allocator *)0x0) ||
     ((long)local_168.c * local_168.cstep == 0)) goto LAB_003048e0;
  uVar25 = local_b8._0_4_ * (int)local_118;
  if (0 < (int)uVar23) {
    uVar11 = 0;
    do {
      pfVar15 = (float *)(bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var12 = (_func_int ***)
                  ((long)(_func_int ***)local_168.data +
                  local_168.cstep * uVar11 * local_168.elemsize);
      if ((int)uVar25 < 8) {
        uVar8 = 0;
      }
      else {
        iVar19 = 7;
        do {
          auVar2._4_4_ = pfVar15[1] * pfVar15[1];
          auVar2._0_4_ = *pfVar15 * *pfVar15;
          auVar2._8_4_ = pfVar15[2] * pfVar15[2];
          auVar2._12_4_ = pfVar15[3] * pfVar15[3];
          auVar2._16_4_ = pfVar15[4] * pfVar15[4];
          auVar2._20_4_ = pfVar15[5] * pfVar15[5];
          auVar2._24_4_ = pfVar15[6] * pfVar15[6];
          auVar2._28_4_ = pfVar15[7];
          *(undefined1 (*) [32])ppp_Var12 = auVar2;
          pfVar15 = pfVar15 + 8;
          ppp_Var12 = ppp_Var12 + 4;
          iVar19 = iVar19 + 8;
          uVar8 = uVar25 & 0xfffffff8;
        } while (iVar19 < (int)uVar25);
      }
      if (uVar25 - uVar8 != 0 && (int)uVar8 <= (int)uVar25) {
        lVar22 = 0;
        do {
          *(float *)((long)ppp_Var12 + lVar22 * 4) = pfVar15[lVar22] * pfVar15[lVar22];
          lVar22 = lVar22 + 1;
        } while (uVar25 - uVar8 != (int)lVar22);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar27);
  }
  pp_Var9 = this->_vptr_LRN_x86_avx;
  local_170 = uVar27;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) == 0) {
    local_1d8.cstep = 0;
    local_1d8.data = (Allocator *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.elemsize._0_4_ = 0;
    local_1d8.elemsize._4_4_ = 0;
    local_1d8.elempack = 0;
    local_1d8.allocator = (Allocator *)0x0;
    local_1d8.dims = 0;
    local_1d8.w = 0;
    local_1d8.h = 0;
    local_1d8.d = 0;
    local_1d8.c = 0;
    auVar34 = ZEXT1664(auVar31);
    Mat::create(&local_1d8,(int)local_118,local_b8._0_4_,uVar23,_elemsize,opt->workspace_allocator);
    if (((Allocator *)local_1d8.data == (Allocator *)0x0) ||
       (local_1d8.cstep * (long)local_1d8.c == 0)) {
      piVar6 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
joined_r0x003048b8:
            if ((Allocator *)local_1d8.data != (Allocator *)0x0) {
              free(local_1d8.data);
            }
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_003048db:
      iVar19 = -100;
      goto LAB_003048e0;
    }
    uVar8 = (int)local_1d8.cstep * local_1d8.c;
    if (0 < (int)uVar8) {
      memset(local_1d8.data,0,(ulong)uVar8 << 2);
    }
    if (0 < (int)uVar23) {
      pp_Var9 = this->_vptr_LRN_x86_avx;
      local_f8._0_4_ =
           *(float *)(&this->field_0xd8 + (long)pp_Var9[-3]) /
           (float)*(int *)(&this->field_0xd4 + (long)pp_Var9[-3]);
      local_f8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar31 = vshufps_avx(local_f8,local_f8,0);
      local_b8._16_16_ = auVar31;
      local_b8._0_16_ = auVar31;
      uVar11 = 0;
      local_180 = CONCAT44(local_180._4_4_,uVar25) & 0xfffffffffffffff8;
      uVar23 = uVar25 & 0xfffffff8;
      local_1e0 = bottom_top_blob;
      do {
        auVar54._8_4_ = 0x3f3504f3;
        auVar54._0_8_ = 0x3f3504f33f3504f3;
        auVar51._8_4_ = 0x3f000000;
        auVar51._0_8_ = 0x3f0000003f000000;
        auVar49._8_4_ = 0x807fffff;
        auVar49._0_8_ = 0x807fffff807fffff;
        auVar46._8_4_ = 0x800000;
        auVar46._0_8_ = 0x80000000800000;
        auVar54._12_4_ = 0x3f3504f3;
        auVar51._12_4_ = 0x3f000000;
        auVar49._12_4_ = 0x807fffff;
        auVar46._12_4_ = 0x800000;
        auVar54._16_4_ = 0x3f3504f3;
        auVar51._16_4_ = 0x3f000000;
        auVar49._16_4_ = 0x807fffff;
        auVar46._16_4_ = 0x800000;
        auVar54._20_4_ = 0x3f3504f3;
        auVar51._20_4_ = 0x3f000000;
        auVar49._20_4_ = 0x807fffff;
        auVar46._20_4_ = 0x800000;
        auVar54._24_4_ = 0x3f3504f3;
        auVar51._24_4_ = 0x3f000000;
        auVar49._24_4_ = 0x807fffff;
        auVar46._24_4_ = 0x800000;
        auVar54._28_4_ = 0x3f3504f3;
        auVar51._28_4_ = 0x3f000000;
        auVar49._28_4_ = 0x807fffff;
        auVar46._28_4_ = 0x800000;
        p_Var13 = pp_Var9[-3];
        iVar19 = *(int *)(&this->field_0xd4 + (long)p_Var13) / 2;
        iVar24 = (int)uVar11;
        uVar8 = iVar24 - iVar19;
        if ((int)uVar8 <= iVar19 + iVar24) {
          do {
            if (uVar8 < (uint)uVar27) {
              ppp_Var12 = (_func_int ***)
                          ((long)(_func_int ***)local_168.data +
                          uVar8 * local_168.cstep * local_168.elemsize);
              ppp_Var16 = (_func_int ***)
                          ((long)(_func_int ***)local_1d8.data +
                          local_1d8.cstep * uVar11 *
                          CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize));
              uVar20 = 0;
              if (7 < (int)uVar25) {
                iVar19 = 7;
                do {
                  auVar29._0_4_ = *(float *)ppp_Var16 + *(float *)ppp_Var12;
                  auVar29._4_4_ = *(float *)((long)ppp_Var16 + 4) + *(float *)((long)ppp_Var12 + 4);
                  auVar29._8_4_ = *(float *)(ppp_Var16 + 1) + *(float *)(ppp_Var12 + 1);
                  auVar29._12_4_ =
                       *(float *)((long)(ppp_Var16 + 1) + 4) + *(float *)((long)(ppp_Var12 + 1) + 4)
                  ;
                  auVar29._16_4_ = *(float *)(ppp_Var16 + 2) + *(float *)(ppp_Var12 + 2);
                  auVar29._20_4_ =
                       *(float *)((long)(ppp_Var16 + 2) + 4) + *(float *)((long)(ppp_Var12 + 2) + 4)
                  ;
                  auVar29._24_4_ = *(float *)(ppp_Var16 + 3) + *(float *)(ppp_Var12 + 3);
                  auVar29._28_4_ =
                       *(float *)((long)(ppp_Var16 + 3) + 4) + *(float *)((long)(ppp_Var12 + 3) + 4)
                  ;
                  *(undefined1 (*) [32])ppp_Var16 = auVar29;
                  ppp_Var12 = ppp_Var12 + 4;
                  ppp_Var16 = ppp_Var16 + 4;
                  iVar19 = iVar19 + 8;
                  uVar20 = uVar23;
                } while (iVar19 < (int)uVar25);
              }
              if (uVar25 - uVar20 != 0 && (int)uVar20 <= (int)uVar25) {
                lVar22 = 0;
                do {
                  *(float *)((long)ppp_Var16 + lVar22 * 4) =
                       *(float *)((long)ppp_Var16 + lVar22 * 4) +
                       *(float *)((long)ppp_Var12 + lVar22 * 4);
                  lVar22 = lVar22 + 1;
                } while (uVar25 - uVar20 != (int)lVar22);
              }
            }
            p_Var13 = pp_Var9[-3];
            bVar1 = (int)uVar8 < *(int *)(&this->field_0xd4 + (long)p_Var13) / 2 + iVar24;
            uVar8 = uVar8 + 1;
          } while (bVar1);
        }
        pauVar26 = (undefined1 (*) [32])
                   (local_1e0->cstep * uVar11 * local_1e0->elemsize + (long)local_1e0->data);
        ppp_Var12 = (_func_int ***)
                    ((long)(_func_int ***)local_1d8.data +
                    local_1d8.cstep * uVar11 *
                    CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize));
        uVar8 = 0;
        if (7 < (int)uVar25) {
          fStack_110 = *(float *)(&this->field_0xe0 + (long)p_Var13);
          local_118 = CONCAT44(fStack_110,fStack_110);
          fVar28 = *(float *)(&this->field_0xdc + (long)p_Var13);
          auVar31._0_8_ = CONCAT44(fVar28,fVar28) ^ 0x8000000080000000;
          auVar31._8_4_ = -fVar28;
          auVar31._12_4_ = -fVar28;
          auVar30._16_16_ = auVar31;
          auVar30._0_16_ = auVar31;
          iVar19 = 7;
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar52._8_4_ = 0xffffff81;
          auVar52._0_8_ = 0xffffff81ffffff81;
          auVar52._12_4_ = 0xffffff81;
          auVar53._8_4_ = 0x3f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          auVar53._12_4_ = 0x3f800000;
          do {
            auVar33._0_4_ = local_b8._0_4_ * *(float *)ppp_Var12 + fStack_110;
            auVar33._4_4_ = local_b8._4_4_ * *(float *)((long)ppp_Var12 + 4) + fStack_110;
            auVar33._8_4_ = local_b8._8_4_ * *(float *)(ppp_Var12 + 1) + fStack_110;
            auVar33._12_4_ = local_b8._12_4_ * *(float *)((long)(ppp_Var12 + 1) + 4) + fStack_110;
            auVar33._16_4_ = local_b8._16_4_ * *(float *)(ppp_Var12 + 2) + fStack_110;
            auVar33._20_4_ = local_b8._20_4_ * *(float *)((long)(ppp_Var12 + 2) + 4) + fStack_110;
            auVar33._24_4_ = local_b8._24_4_ * *(float *)(ppp_Var12 + 3) + fStack_110;
            auVar33._28_4_ = auVar34._28_4_ + fStack_110;
            auVar3 = vmaxps_avx(auVar33,auVar46);
            auVar2 = vandps_avx(auVar3,auVar49);
            auVar4 = vorps_avx(auVar2,auVar51);
            auVar29 = vcmpps_avx(auVar54,auVar4,2);
            auVar50 = vpsrld_avx(auVar3._16_16_,0x17);
            auVar2 = vandnps_avx(auVar29,auVar4);
            fVar28 = auVar4._0_4_ + -1.0 + auVar2._0_4_;
            fVar40 = auVar4._4_4_ + -1.0 + auVar2._4_4_;
            fVar41 = auVar4._8_4_ + -1.0 + auVar2._8_4_;
            fVar42 = auVar4._12_4_ + -1.0 + auVar2._12_4_;
            fVar43 = auVar4._16_4_ + -1.0 + auVar2._16_4_;
            fVar44 = auVar4._20_4_ + -1.0 + auVar2._20_4_;
            fVar45 = auVar4._24_4_ + -1.0 + auVar2._24_4_;
            auVar48 = vpsubd_avx(auVar50,auVar29._16_16_);
            auVar50 = vpsrld_avx(auVar3._0_16_,0x17);
            auVar50 = vpsubd_avx(auVar50,auVar29._0_16_);
            auVar50 = vpaddd_avx(auVar52,auVar50);
            auVar48 = vpaddd_avx(auVar52,auVar48);
            auVar47._16_16_ = auVar48;
            auVar47._0_16_ = auVar50;
            auVar3 = vcvtdq2ps_avx(auVar47);
            auVar29 = vcmpps_avx(auVar33,ZEXT432(0) << 0x20,2);
            auVar35._0_4_ =
                 auVar3._0_4_ * 0.6931472 + fVar28 +
                 fVar28 * fVar28 *
                 (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28 +
                       -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28 +
                    0.20000714) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 + -0.5);
            auVar35._4_4_ =
                 auVar3._4_4_ * 0.6931472 + fVar40 +
                 fVar40 * fVar40 *
                 (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                       -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 +
                    0.20000714) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5);
            auVar35._8_4_ =
                 auVar3._8_4_ * 0.6931472 + fVar41 +
                 fVar41 * fVar41 *
                 (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                       -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 +
                    0.20000714) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5);
            auVar35._12_4_ =
                 auVar3._12_4_ * 0.6931472 + fVar42 +
                 fVar42 * fVar42 *
                 (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) * fVar42 +
                       -0.12420141) * fVar42 + 0.14249323) * fVar42 + -0.16668057) * fVar42 +
                    0.20000714) * fVar42 + -0.24999994) * fVar42 + 0.3333333) * fVar42 + -0.5);
            auVar35._16_4_ =
                 auVar3._16_4_ * 0.6931472 + fVar43 +
                 fVar43 * fVar43 *
                 (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                       -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 +
                    0.20000714) * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5);
            auVar35._20_4_ =
                 auVar3._20_4_ * 0.6931472 + fVar44 +
                 fVar44 * fVar44 *
                 (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                       -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 +
                    0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5);
            auVar35._24_4_ =
                 auVar3._24_4_ * 0.6931472 + fVar45 +
                 fVar45 * fVar45 *
                 (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                       -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 +
                    0.20000714) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5);
            auVar35._28_4_ = auVar3._28_4_ + auVar4._28_4_ + -1.0 + auVar2._28_4_ + -0.16666669;
            auVar2 = vorps_avx(auVar29,auVar35);
            local_98._0_4_ = (undefined4)auVar31._0_8_;
            local_98._4_4_ = (undefined4)(auVar31._0_8_ >> 0x20);
            auVar3._4_4_ = auVar2._4_4_ * (float)local_98._4_4_;
            auVar3._0_4_ = auVar2._0_4_ * (float)local_98._0_4_;
            auVar3._8_4_ = auVar2._8_4_ * auVar31._8_4_;
            auVar3._12_4_ = auVar2._12_4_ * auVar31._12_4_;
            auVar3._16_4_ = auVar2._16_4_ * (float)local_98._0_4_;
            auVar3._20_4_ = auVar2._20_4_ * (float)local_98._4_4_;
            auVar3._24_4_ = auVar2._24_4_ * auVar31._8_4_;
            auVar3._28_4_ = auVar2._28_4_;
            auVar36._8_4_ = 0x42b0c0a5;
            auVar36._0_8_ = 0x42b0c0a542b0c0a5;
            auVar36._12_4_ = 0x42b0c0a5;
            auVar36._16_4_ = 0x42b0c0a5;
            auVar36._20_4_ = 0x42b0c0a5;
            auVar36._24_4_ = 0x42b0c0a5;
            auVar36._28_4_ = 0x42b0c0a5;
            auVar2 = vminps_avx(auVar3,auVar36);
            auVar37._8_4_ = 0xc2b0c0a5;
            auVar37._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar37._12_4_ = 0xc2b0c0a5;
            auVar37._16_4_ = 0xc2b0c0a5;
            auVar37._20_4_ = 0xc2b0c0a5;
            auVar37._24_4_ = 0xc2b0c0a5;
            auVar37._28_4_ = 0xc2b0c0a5;
            auVar29 = vmaxps_avx(auVar2,auVar37);
            auVar38._0_4_ = auVar29._0_4_ * 1.442695 + 0.5;
            auVar38._4_4_ = auVar29._4_4_ * 1.442695 + 0.5;
            auVar38._8_4_ = auVar29._8_4_ * 1.442695 + 0.5;
            auVar38._12_4_ = auVar29._12_4_ * 1.442695 + 0.5;
            auVar38._16_4_ = auVar29._16_4_ * 1.442695 + 0.5;
            auVar38._20_4_ = auVar29._20_4_ * 1.442695 + 0.5;
            auVar38._24_4_ = auVar29._24_4_ * 1.442695 + 0.5;
            auVar38._28_4_ = 0x3ff8aa3b;
            auVar3 = vroundps_avx(auVar38,1);
            auVar2 = vcmpps_avx(auVar38,auVar3,1);
            auVar2 = vandps_avx(auVar2,auVar32);
            auVar2 = vsubps_avx(auVar3,auVar2);
            auVar4._4_4_ = auVar2._4_4_ * 0.6931472;
            auVar4._0_4_ = auVar2._0_4_ * 0.6931472;
            auVar4._8_4_ = auVar2._8_4_ * 0.6931472;
            auVar4._12_4_ = auVar2._12_4_ * 0.6931472;
            auVar4._16_4_ = auVar2._16_4_ * 0.6931472;
            auVar4._20_4_ = auVar2._20_4_ * 0.6931472;
            auVar4._24_4_ = auVar2._24_4_ * 0.6931472;
            auVar4._28_4_ = auVar3._28_4_;
            auVar29 = vsubps_avx(auVar29,auVar4);
            fVar28 = auVar29._0_4_;
            fVar40 = auVar29._4_4_;
            fVar41 = auVar29._8_4_;
            fVar42 = auVar29._12_4_;
            fVar43 = auVar29._16_4_;
            fVar44 = auVar29._20_4_;
            fVar45 = auVar29._24_4_;
            auVar50._0_4_ = (int)auVar2._0_4_;
            auVar50._4_4_ = (int)auVar2._4_4_;
            auVar50._8_4_ = (int)auVar2._8_4_;
            auVar50._12_4_ = (int)auVar2._12_4_;
            auVar39._16_4_ = (int)auVar2._16_4_;
            auVar39._0_16_ = auVar50;
            auVar39._20_4_ = (int)auVar2._20_4_;
            auVar39._24_4_ = (int)auVar2._24_4_;
            auVar39._28_4_ = (int)auVar2._28_4_;
            auVar48 = vpslld_avx(auVar50,0x17);
            auVar50 = vpslld_avx(auVar39._16_16_,0x17);
            auVar50 = vpaddd_avx(auVar53,auVar50);
            auVar48 = vpaddd_avx(auVar53,auVar48);
            auVar5._4_4_ = auVar48._4_4_ * *(float *)(*pauVar26 + 4) *
                           (fVar40 + 1.0 +
                           fVar40 * fVar40 *
                           (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) *
                              fVar40 + 0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5));
            auVar5._0_4_ = auVar48._0_4_ * *(float *)*pauVar26 *
                           (fVar28 + 1.0 +
                           fVar28 * fVar28 *
                           (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) *
                              fVar28 + 0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5));
            auVar5._8_4_ = auVar48._8_4_ * *(float *)(*pauVar26 + 8) *
                           (fVar41 + 1.0 +
                           fVar41 * fVar41 *
                           (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) *
                              fVar41 + 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5));
            auVar5._12_4_ =
                 auVar48._12_4_ * *(float *)(*pauVar26 + 0xc) *
                 (fVar42 + 1.0 +
                 fVar42 * fVar42 *
                 (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                   0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5));
            auVar5._16_4_ =
                 auVar50._0_4_ * *(float *)(*pauVar26 + 0x10) *
                 (fVar43 + 1.0 +
                 fVar43 * fVar43 *
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5));
            auVar5._20_4_ =
                 auVar50._4_4_ * *(float *)(*pauVar26 + 0x14) *
                 (fVar44 + 1.0 +
                 fVar44 * fVar44 *
                 (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                   0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5));
            auVar5._24_4_ =
                 auVar50._8_4_ * *(float *)(*pauVar26 + 0x18) *
                 (fVar45 + 1.0 +
                 fVar45 * fVar45 *
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5));
            auVar5._28_4_ = auVar29._28_4_ + 1.0 + 0.71826285;
            auVar34 = ZEXT3264(auVar5);
            *pauVar26 = auVar5;
            ppp_Var12 = ppp_Var12 + 4;
            pauVar26 = pauVar26 + 1;
            iVar19 = iVar19 + 8;
            uVar8 = uVar23;
            fStack_10c = fStack_110;
            fStack_108 = fStack_110;
            fStack_104 = fStack_110;
            fStack_100 = fStack_110;
            fStack_fc = fStack_110;
            local_98 = auVar30;
          } while (iVar19 < (int)uVar25);
        }
        local_178 = uVar11;
        if (uVar25 - uVar8 != 0 && (int)uVar8 <= (int)uVar25) {
          lVar22 = 0;
          do {
            auVar34 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
            fVar28 = powf((float)local_f8._0_4_ * *(float *)((long)ppp_Var12 + lVar22 * 4) +
                          *(float *)(&this->field_0xe0 + (long)pp_Var9[-3]),
                          -*(float *)(&this->field_0xdc + (long)pp_Var9[-3]));
            *(float *)(*pauVar26 + lVar22 * 4) = fVar28 * *(float *)(*pauVar26 + lVar22 * 4);
            lVar22 = lVar22 + 1;
          } while (uVar25 - uVar8 != (int)lVar22);
        }
        uVar11 = local_178 + 1;
        uVar27 = local_170;
        uVar23 = (uint)local_180;
      } while (uVar11 != local_170);
    }
    piVar6 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
    iVar19 = 0;
    if (piVar6 == (int *)0x0) goto LAB_003048e0;
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) goto LAB_003048e0;
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      goto LAB_003048e0;
    }
  }
  else {
    if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 1) {
      iVar19 = 0;
      goto LAB_003048e0;
    }
    piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    local_1d8.data = local_168.data;
    local_1d8.refcount._0_4_ = (int)local_168.refcount;
    local_1d8.refcount._4_4_ = local_168.refcount._4_4_;
    local_1d8.elemsize._0_4_ = (undefined4)local_168.elemsize;
    local_1d8.elemsize._4_4_ = (undefined4)(local_168.elemsize >> 0x20);
    local_1d8.elempack = local_168.elempack;
    local_1d8.allocator = local_168.allocator;
    local_1d8.dims = local_168.dims;
    local_1d8.w = local_168.w;
    local_1d8.h = local_168.h;
    local_1d8.d = local_168.d;
    local_1d8.c = local_168.c;
    local_1d8.cstep = local_168.cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
      pp_Var9 = this->_vptr_LRN_x86_avx;
    }
    p_Var13 = pp_Var9[-3];
    uVar25 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
    iVar19 = (int)local_118;
    if (1 < (int)uVar25) {
      uVar25 = uVar25 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar19 = ~uVar25 + *(int *)(&this->field_0xd4 + (long)pp_Var9[-3]);
      copy_make_border(&local_168,&local_1d8,uVar25,iVar19,uVar25,iVar19,0,0.0,(Option *)&_space_ofs
                      );
      if (((Allocator *)local_1d8.data == (Allocator *)0x0) ||
         ((long)local_1d8.c * local_1d8.cstep == 0)) {
        piVar6 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1d8.allocator == (Allocator *)0x0) goto joined_r0x003048b8;
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_003048db;
      }
      p_Var13 = this->_vptr_LRN_x86_avx[-3];
      uVar25 = *(uint *)(&this->field_0xd4 + (long)p_Var13);
      iVar19 = local_1d8.w;
    }
    local_98._0_4_ = uVar25;
    uVar25 = uVar25 * uVar25;
    local_f8._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var13);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar25,&local_1e1);
    piVar7 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pp_Var9 = this->_vptr_LRN_x86_avx;
    iVar24 = *(int *)(&this->field_0xd4 + (long)pp_Var9[-3]);
    if (0 < iVar24) {
      iVar19 = iVar19 - iVar24;
      iVar10 = 0;
      iVar14 = 0;
      iVar18 = 0;
      do {
        if (0 < iVar24) {
          lVar22 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar18 + lVar22] = iVar14 + (int)lVar22;
            iVar24 = *(int *)(&this->field_0xd4 + (long)pp_Var9[-3]);
            lVar22 = lVar22 + 1;
            iVar21 = (int)lVar22;
          } while (iVar21 < iVar24);
          iVar18 = iVar18 + iVar21;
          iVar14 = iVar14 + iVar21;
        }
        iVar14 = iVar14 + iVar19;
        iVar10 = iVar10 + 1;
      } while (iVar10 < iVar24);
    }
    if (0 < (int)uVar23) {
      local_180 = (ulong)(int)local_118;
      local_d0 = bottom_top_blob->data;
      local_d8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_e0 = (Allocator *)local_1d8.data;
      local_e8 = local_1d8.cstep * CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize)
      ;
      local_c8 = (long)local_1d8.w *
                 CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      local_178 = CONCAT44(local_178._4_4_,1.0 / (float)(int)uVar25);
      local_188 = 0;
      do {
        if (0 < (int)local_b8._0_4_) {
          local_c0 = (_func_int ***)((long)&local_e0->_vptr_Allocator + local_e8 * local_188);
          pvVar17 = (void *)(local_d8 * local_188 + (long)local_d0);
          pp_Var9 = this->_vptr_LRN_x86_avx;
          local_1e0 = (Mat *)0x0;
          do {
            ppp_Var12 = local_c0;
            if (0 < (int)local_118) {
              lVar22 = local_c8 * (long)local_1e0;
              uVar27 = 0;
              do {
                if (local_98._0_4_ == 0) {
                  fVar28 = 0.0;
                }
                else {
                  fVar28 = 0.0;
                  uVar11 = 0;
                  do {
                    fVar28 = fVar28 + *(float *)((long)ppp_Var12 +
                                                (long)piVar7[uVar11] * 4 + uVar27 * 4 + lVar22);
                    uVar11 = uVar11 + 1;
                  } while (uVar25 + (uVar25 == 0) != uVar11);
                }
                fVar28 = powf(fVar28 * (float)local_f8._0_4_ * (float)local_178 +
                              *(float *)(&this->field_0xe0 + (long)pp_Var9[-3]),
                              -*(float *)(&this->field_0xdc + (long)pp_Var9[-3]));
                *(float *)((long)pvVar17 + uVar27 * 4) =
                     fVar28 * *(float *)((long)pvVar17 + uVar27 * 4);
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_118);
            }
            pvVar17 = (void *)((long)pvVar17 + local_180 * 4);
            local_1e0 = (Mat *)((long)&local_1e0->data + 1);
          } while (local_1e0 != (Mat *)local_b8._0_8_);
        }
        local_188 = local_188 + 1;
      } while (local_188 != local_170);
    }
    if (piVar7 != (pointer)0x0) {
      operator_delete(piVar7,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar7);
    }
    piVar6 = (int *)CONCAT44(local_1d8.refcount._4_4_,(int)local_1d8.refcount);
    iVar19 = 0;
    if (piVar6 == (int *)0x0) goto LAB_003048e0;
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) goto LAB_003048e0;
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      goto LAB_003048e0;
    }
  }
  iVar19 = 0;
  if ((Allocator *)local_1d8.data != (Allocator *)0x0) {
    iVar19 = 0;
    free(local_1d8.data);
  }
LAB_003048e0:
  piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_168.data != (Allocator *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int LRN_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}